

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall
StaticContentsSock::Accept(StaticContentsSock *this,sockaddr *addr,socklen_t *addr_len)

{
  uint *in_RCX;
  long in_FS_OFFSET;
  _func_int **local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (addr_len != (socklen_t *)0x0) {
    memset(addr_len,0,(ulong)*in_RCX);
    if (0xf < *in_RCX) {
      *in_RCX = 0x10;
      addr_len[0] = 0x851a0002;
      addr_len[1] = 0x5050505;
    }
  }
  std::make_unique<StaticContentsSock,char_const(&)[1]>((char (*) [1])&local_28);
  (this->super_Sock)._vptr_Sock = local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> Accept(sockaddr* addr, socklen_t* addr_len) const override
    {
        if (addr != nullptr) {
            // Pretend all connections come from 5.5.5.5:6789
            memset(addr, 0x00, *addr_len);
            const socklen_t write_len = static_cast<socklen_t>(sizeof(sockaddr_in));
            if (*addr_len >= write_len) {
                *addr_len = write_len;
                sockaddr_in* addr_in = reinterpret_cast<sockaddr_in*>(addr);
                addr_in->sin_family = AF_INET;
                memset(&addr_in->sin_addr, 0x05, sizeof(addr_in->sin_addr));
                addr_in->sin_port = htons(6789);
            }
        }
        return std::make_unique<StaticContentsSock>("");
    }